

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::RecordStatementAdjustment
          (FunctionBody *this,uint offset,StatementAdjustmentType adjType)

{
  AuxStatementData *pAVar1;
  Recycler *this_00;
  Recycler *alloc;
  List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *ptr;
  undefined **local_50;
  StatementAdjustmentRecord record;
  
  EnsureAuxStatementData(this);
  pAVar1 = (this->m_sourceInfo).m_auxStatementData.ptr;
  this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  if ((pAVar1 == (AuxStatementData *)0x0) ||
     ((pAVar1->m_statementAdjustmentRecords).ptr ==
      (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0)) {
    local_50 = &JsUtil::
                List<Js::FunctionBody::StatementAdjustmentRecord,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    record.m_byteCodeOffset = 0;
    record.m_adjustmentType = SAT_None;
    record._6_2_ = 0;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)&stack0xffffffffffffffb0);
    ptr = (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
           *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
    (ptr->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    ).alloc = this_00;
    (ptr->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01377c38;
    (ptr->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (StatementAdjustmentRecord *)0x0;
    (ptr->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    ptr->length = 0;
    ptr->increment = 4;
    Memory::
    WriteBarrierPtr<JsUtil::List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::WriteBarrierSet(&((this->m_sourceInfo).m_auxStatementData.ptr)->m_statementAdjustmentRecords,
                      ptr);
  }
  StatementAdjustmentRecord::StatementAdjustmentRecord
            ((StatementAdjustmentRecord *)&stack0xffffffffffffffb0,adjType,offset);
  JsUtil::
  List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add((((this->m_sourceInfo).m_auxStatementData.ptr)->m_statementAdjustmentRecords).ptr,
        (StatementAdjustmentRecord *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void
    FunctionBody::RecordStatementAdjustment(uint offset, StatementAdjustmentType adjType)
    {
        this->EnsureAuxStatementData();

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        if (this->GetStatementAdjustmentRecords() == nullptr)
        {
            m_sourceInfo.m_auxStatementData->m_statementAdjustmentRecords = RecyclerNew(recycler, StatementAdjustmentRecordList, recycler);
        }

        StatementAdjustmentRecord record(adjType, offset);
        this->GetStatementAdjustmentRecords()->Add(record); // Will copy stack value and put the copy into the container.
    }